

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.cpp
# Opt level: O0

void __thiscall
basisu::image_metrics::calc
          (image_metrics *this,image *a,image *b,uint32_t first_chan,uint32_t total_chans,
          bool avg_comp_error,bool use_601_luma)

{
  uint32_t a_00;
  uint32_t uVar1;
  uint32_t b_00;
  int iVar2;
  uint uVar3;
  color_rgba *this_00;
  color_rgba *this_01;
  byte *pbVar4;
  uint in_ECX;
  image *in_RDX;
  image *in_RSI;
  float *in_RDI;
  uint in_R8D;
  byte in_R9B;
  float fVar5;
  double dVar6;
  byte in_stack_00000008;
  double total_values;
  double v;
  uint32_t i;
  double sum2;
  double sum;
  uint32_t c;
  color_rgba *cb;
  color_rgba *ca;
  uint32_t x;
  uint32_t y;
  double hist [256];
  uint32_t height;
  uint32_t width;
  uint32_t in_stack_fffffffffffff73c;
  undefined4 in_stack_fffffffffffff740;
  undefined4 in_stack_fffffffffffff744;
  uint32_t in_stack_fffffffffffff748;
  uint32_t in_stack_fffffffffffff74c;
  uint in_stack_fffffffffffff750;
  double local_880;
  uint local_86c;
  double local_868;
  double local_860;
  uint local_854;
  uint local_840;
  uint local_83c;
  double local_838 [257];
  uint local_2c;
  uint local_28;
  byte local_22;
  byte local_21;
  uint local_20;
  image *local_18;
  image *local_10;
  
  local_21 = in_R9B & 1;
  local_22 = in_stack_00000008 & 1;
  if (3 < in_ECX || 4 < in_ECX + in_R8D) {
    __assert_fail("(first_chan < 4U) && (first_chan + total_chans <= 4U)",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_enc.cpp"
                  ,0x56b,
                  "void basisu::image_metrics::calc(const image &, const image &, uint32_t, uint32_t, bool, bool)"
                 );
  }
  local_20 = in_R8D;
  local_18 = in_RDX;
  local_10 = in_RSI;
  a_00 = image::get_width(in_RSI);
  uVar1 = image::get_width(local_18);
  local_28 = minimum<unsigned_int>(a_00,uVar1);
  uVar1 = image::get_height(local_10);
  b_00 = image::get_height(local_18);
  local_2c = minimum<unsigned_int>(uVar1,b_00);
  clear_obj<double[256]>((double (*) [256])0x4d239f);
  for (local_83c = 0; local_83c < local_2c; local_83c = local_83c + 1) {
    for (local_840 = 0; local_840 < local_28; local_840 = local_840 + 1) {
      this_00 = image::operator()((image *)CONCAT44(a_00,in_stack_fffffffffffff750),
                                  in_stack_fffffffffffff74c,in_stack_fffffffffffff748);
      this_01 = image::operator()((image *)CONCAT44(a_00,in_stack_fffffffffffff750),
                                  in_stack_fffffffffffff74c,in_stack_fffffffffffff748);
      if (local_20 == 0) {
        if ((local_22 & 1) == 0) {
          in_stack_fffffffffffff748 = color_rgba::get_709_luma(this_00);
          iVar2 = color_rgba::get_709_luma(this_01);
          uVar1 = iabs(in_stack_fffffffffffff748 - iVar2);
          local_838[uVar1] = local_838[uVar1] + 1.0;
        }
        else {
          in_stack_fffffffffffff74c = color_rgba::get_601_luma(this_00);
          iVar2 = color_rgba::get_601_luma(this_01);
          uVar1 = iabs(in_stack_fffffffffffff74c - iVar2);
          local_838[uVar1] = local_838[uVar1] + 1.0;
        }
      }
      else {
        for (local_854 = 0; local_854 < local_20; local_854 = local_854 + 1) {
          pbVar4 = color_rgba::operator[]
                             ((color_rgba *)
                              CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                              in_stack_fffffffffffff73c);
          in_stack_fffffffffffff750 = (uint)*pbVar4;
          pbVar4 = color_rgba::operator[]
                             ((color_rgba *)
                              CONCAT44(in_stack_fffffffffffff744,in_stack_fffffffffffff740),
                              in_stack_fffffffffffff73c);
          uVar1 = iabs(in_stack_fffffffffffff750 - *pbVar4);
          local_838[uVar1] = local_838[uVar1] + 1.0;
        }
      }
    }
  }
  *in_RDI = 0.0;
  local_860 = 0.0;
  local_868 = 0.0;
  for (local_86c = 0; local_86c < 0x100; local_86c = local_86c + 1) {
    if ((local_838[local_86c] != 0.0) || (NAN(local_838[local_86c]))) {
      fVar5 = maximum<float>(*in_RDI,(float)local_86c);
      *in_RDI = fVar5;
      dVar6 = (double)local_86c * local_838[local_86c];
      local_860 = local_860 + dVar6;
      local_868 = (double)local_86c * dVar6 + local_868;
    }
  }
  local_880 = (double)local_28 * (double)local_2c;
  if ((local_21 & 1) != 0) {
    uVar3 = clamp<unsigned_int>(local_20,1,4);
    local_880 = (double)uVar3 * local_880;
  }
  dVar6 = clamp<double>(local_860 / local_880,0.0,255.0);
  in_RDI[1] = (float)dVar6;
  dVar6 = clamp<double>(local_868 / local_880,0.0,65025.0);
  in_RDI[2] = (float)dVar6;
  dVar6 = std::sqrt((double)(ulong)(uint)in_RDI[2]);
  in_RDI[3] = SUB84(dVar6,0);
  if ((in_RDI[3] != 0.0) || (NAN(in_RDI[3]))) {
    dVar6 = log10(255.0 / (double)in_RDI[3]);
    dVar6 = clamp<double>(dVar6 * 20.0,0.0,100.0);
    fVar5 = (float)dVar6;
  }
  else {
    fVar5 = 100.0;
  }
  in_RDI[4] = fVar5;
  return;
}

Assistant:

void image_metrics::calc(const image &a, const image &b, uint32_t first_chan, uint32_t total_chans, bool avg_comp_error, bool use_601_luma)
	{
		assert((first_chan < 4U) && (first_chan + total_chans <= 4U));

		const uint32_t width = basisu::minimum(a.get_width(), b.get_width());
		const uint32_t height = basisu::minimum(a.get_height(), b.get_height());

		double hist[256];
		clear_obj(hist);

		for (uint32_t y = 0; y < height; y++)
		{
			for (uint32_t x = 0; x < width; x++)
			{
				const color_rgba &ca = a(x, y), &cb = b(x, y);

				if (total_chans)
				{
					for (uint32_t c = 0; c < total_chans; c++)
						hist[iabs(ca[first_chan + c] - cb[first_chan + c])]++;
				}
				else
				{
					if (use_601_luma)
						hist[iabs(ca.get_601_luma() - cb.get_601_luma())]++;
					else
						hist[iabs(ca.get_709_luma() - cb.get_709_luma())]++;
				}
			}
		}

		m_max = 0;
		double sum = 0.0f, sum2 = 0.0f;
		for (uint32_t i = 0; i < 256; i++)
		{
			if (hist[i])
			{
				m_max = basisu::maximum<float>(m_max, (float)i);
				double v = i * hist[i];
				sum += v;
				sum2 += i * v;
			}
		}

		double total_values = (double)width * (double)height;
		if (avg_comp_error)
			total_values *= (double)clamp<uint32_t>(total_chans, 1, 4);

		m_mean = (float)clamp<double>(sum / total_values, 0.0f, 255.0);
		m_mean_squared = (float)clamp<double>(sum2 / total_values, 0.0f, 255.0f * 255.0f);
		m_rms = (float)sqrt(m_mean_squared);
		m_psnr = m_rms ? (float)clamp<double>(log10(255.0 / m_rms) * 20.0f, 0.0f, 100.0f) : 100.0f;
	}